

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties.h
# Opt level: O1

void __thiscall gutil::Properties::Properties(Properties *this,char *name)

{
  _Rb_tree_header *p_Var1;
  
  p_Var1 = &(this->data)._M_t._M_impl.super__Rb_tree_header;
  (this->data)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->data)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->data)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->data)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->data)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  load(this,name);
  return;
}

Assistant:

explicit Properties(const char *name)
    {
      load(name);
    }